

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

int * __thiscall embree::Stream<int>::peek(Stream<int> *this)

{
  pointer ppVar1;
  size_t sVar2;
  size_t sVar3;
  runtime_error *this_00;
  ParseLocation l;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  int local_40;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if (this->future == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&local_60,this);
    local_40 = (*(this->super_RefCount)._vptr_RefCount[4])(this);
    local_38 = local_60;
    local_30._M_pi = local_58;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_58->_M_use_count = local_58->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_58->_M_use_count = local_58->_M_use_count + 1;
      }
    }
    local_28 = local_50;
    uStack_24 = uStack_4c;
    uStack_20 = uStack_48;
    uStack_1c = uStack_44;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    sVar2 = this->past;
    sVar3 = this->future;
    if (sVar3 + sVar2 == 0x400) {
      if (sVar2 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this->start = (ulong)((int)this->start + 1U & 0x3ff);
      this->past = sVar2 - 1;
    }
    this->future = sVar3 + 1;
    ppVar1 = (this->buffer).
             super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
             ._M_impl.super__Vector_impl_data._M_start +
             ((int)sVar3 + (int)this->start + (int)this->past & 0x3ff);
    ppVar1->first = local_40;
    (ppVar1->second).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_38;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(ppVar1->second).fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_30);
    (ppVar1->second).lineNumber = CONCAT44(uStack_24,local_28);
    (ppVar1->second).colNumber = CONCAT44(uStack_1c,uStack_20);
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    }
  }
  return (int *)((long)&((this->buffer).
                         super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first +
                (ulong)(((int)this->past + (int)this->start & 0x3ffU) * 0x28));
}

Assistant:

const T& peek() {
      if (future == 0) push_back(nextHelper());
      return buffer[(start+past)%BUF_SIZE].first;
    }